

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly1305_vec.cc
# Opt level: O1

void poly1305_first_block(poly1305_state_internal *st,uint8_t *m)

{
  long *plVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  long lVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  ulong uVar39;
  undefined1 auVar40 [16];
  ulong uVar41;
  
  uVar2 = st->P[1].R20.d[1];
  uVar3 = st->P[1].R20.d[3];
  uVar30 = CONCAT44(uVar3,uVar2);
  uVar4 = st->P[1].R21.d[3];
  uVar5 = st->P[1].R21.d[1];
  uVar32 = CONCAT44(uVar4,uVar5);
  uVar6 = st->P[1].R22.d[3];
  uVar7 = st->P[1].R22.d[1];
  uVar31 = CONCAT44(uVar6,uVar7);
  uVar8 = st->P[1].R23.d[3];
  uVar9 = st->P[1].R23.d[1];
  uVar10 = st->P[1].R24.d[3];
  uVar11 = st->P[1].R24.d[1];
  lVar34 = 0x90;
  do {
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar30;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar30;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar32 * 2;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar31 * 0x14;
    auVar12 = auVar13 * auVar19 + auVar12 * auVar18;
    uVar33 = auVar12._0_8_;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar31 * 0x14;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = uVar31;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = uVar30 * 2;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = uVar32;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = uVar32;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = uVar32;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = uVar30;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = uVar31 * 2;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = auVar12._8_8_ << 0x14 | uVar33 >> 0x2c;
    auVar24 = auVar15 * auVar21 + auVar14 * auVar20 + auVar24;
    uVar30 = auVar24._0_8_;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = auVar24._8_8_ << 0x14 | uVar30 >> 0x2c;
    auVar25 = auVar16 * auVar22 + auVar17 * auVar23 + auVar25;
    uVar31 = auVar25._0_8_ & 0x3ffffffffff;
    uVar33 = (auVar25._8_8_ << 0x16 | auVar25._0_8_ >> 0x2a) * 5 + (uVar33 & 0xfffffffffff);
    uVar32 = (uVar33 >> 0x2c) + (uVar30 & 0xfffffffffff);
    uVar30 = uVar33 & 0xfffffffffff;
    uVar26 = (uint)uVar33 & 0x3ffffff;
    auVar35._4_4_ = 0;
    auVar35._0_4_ = uVar26;
    auVar35._8_4_ = uVar26;
    auVar35._12_4_ = 0;
    *(undefined1 (*) [16])((long)&st->P[0].R20 + lVar34) = auVar35;
    uVar26 = (uint)(uVar30 >> 0x1a) | ((uint)uVar32 & 0xff) << 0x12;
    auVar36._0_8_ = CONCAT44(0,uVar26);
    auVar36._8_4_ = uVar26;
    auVar36._12_4_ = 0;
    *(undefined1 (*) [16])((long)&st->P[0].R21 + lVar34) = auVar36;
    uVar27 = (uint)(uVar32 >> 8) & 0x3ffffff;
    auVar37._0_8_ = CONCAT44(0,uVar27);
    auVar37._8_4_ = uVar27;
    auVar37._12_4_ = 0;
    *(undefined1 (*) [16])((long)&st->P[0].R22 + lVar34) = auVar37;
    uVar28 = (uint)(uVar32 >> 0x22) | (auVar25._0_4_ & 0xffff) << 10;
    auVar38._0_8_ = CONCAT44(0,uVar28);
    auVar38._8_4_ = uVar28;
    auVar38._12_4_ = 0;
    *(undefined1 (*) [16])((long)&st->P[0].R23 + lVar34) = auVar38;
    uVar29 = (uint)(uVar31 >> 0x10);
    auVar40._0_8_ = CONCAT44(0,uVar29);
    auVar40._8_4_ = uVar29;
    auVar40._12_4_ = 0;
    *(undefined1 (*) [16])((long)&st->P[0].R24 + lVar34) = auVar40;
    plVar1 = (long *)((long)&st->P[0].S21 + lVar34);
    *plVar1 = auVar36._0_8_ * 5;
    plVar1[1] = (ulong)uVar26 * 5;
    plVar1 = (long *)((long)&st->P[0].S22 + lVar34);
    *plVar1 = auVar37._0_8_ * 5;
    plVar1[1] = (ulong)uVar27 * 5;
    plVar1 = (long *)((long)&st->P[0].S23 + lVar34);
    *plVar1 = auVar38._0_8_ * 5;
    plVar1[1] = (ulong)uVar28 * 5;
    plVar1 = (long *)((long)&st->P[0].S24 + lVar34);
    *plVar1 = auVar40._0_8_ * 5;
    plVar1[1] = (ulong)uVar29 * 5;
    lVar34 = lVar34 + -0x90;
  } while (lVar34 == 0);
  st->P[1].R20.d[1] = uVar2;
  st->P[1].R20.d[3] = uVar3;
  st->P[1].R21.d[1] = uVar5;
  st->P[1].R21.d[3] = uVar4;
  st->P[1].R22.d[1] = uVar7;
  st->P[1].R22.d[3] = uVar6;
  st->P[1].R23.d[1] = uVar9;
  st->P[1].R23.d[3] = uVar8;
  st->P[1].R24.d[1] = uVar11;
  st->P[1].R24.d[3] = uVar10;
  uVar30 = *(ulong *)(m + 0x10);
  uVar31 = *(ulong *)m;
  uVar32 = *(ulong *)(m + 0x18);
  uVar33 = *(ulong *)(m + 8);
  (st->field_1).HH[0] = uVar31 & 0x3ffffff;
  (st->field_1).HH[1] = uVar30 & 0x3ffffff;
  (st->field_1).HH[2] = uVar31 >> 0x1a & 0x3ffffff;
  (st->field_1).HH[3] = uVar30 >> 0x1a & 0x3ffffff;
  uVar39 = uVar33 << 0xc;
  uVar41 = uVar32 << 0xc;
  (st->field_1).HH[4] = uVar39 & 0x3ffffff | uVar31 >> 0x34;
  (st->field_1).HH[5] = uVar41 & 0x3ffffff | uVar30 >> 0x34;
  (st->field_1).HH[6] = uVar39 >> 0x1a & 0x3ffffff;
  (st->field_1).HH[7] = uVar41 >> 0x1a & 0x3ffffff;
  (st->field_1).HH[8] = uVar33 >> 0x28 | 0x1000000;
  (st->field_1).HH[9] = uVar32 >> 0x28 | 0x1000000;
  return;
}

Assistant:

static void poly1305_first_block(poly1305_state_internal *st,
                                 const uint8_t *m) {
  const xmmi MMASK =
      _mm_load_si128((const xmmi *)poly1305_x64_sse2_message_mask);
  const xmmi FIVE = _mm_load_si128((const xmmi *)poly1305_x64_sse2_5);
  const xmmi HIBIT = _mm_load_si128((const xmmi *)poly1305_x64_sse2_1shl128);
  xmmi T5, T6;
  poly1305_power *p;
  uint128_t d[3];
  uint64_t r0, r1, r2;
  uint64_t r20, r21, r22, s22;
  uint64_t pad0, pad1;
  uint64_t c;
  uint64_t i;

  // pull out stored info
  p = &st->P[1];

  r0 = ((uint64_t)p->R20.d[3] << 32) | (uint64_t)p->R20.d[1];
  r1 = ((uint64_t)p->R21.d[3] << 32) | (uint64_t)p->R21.d[1];
  r2 = ((uint64_t)p->R22.d[3] << 32) | (uint64_t)p->R22.d[1];
  pad0 = ((uint64_t)p->R23.d[3] << 32) | (uint64_t)p->R23.d[1];
  pad1 = ((uint64_t)p->R24.d[3] << 32) | (uint64_t)p->R24.d[1];

  // compute powers r^2,r^4
  r20 = r0;
  r21 = r1;
  r22 = r2;
  for (i = 0; i < 2; i++) {
    s22 = r22 * (5 << 2);

    d[0] = add128(mul64x64_128(r20, r20), mul64x64_128(r21 * 2, s22));
    d[1] = add128(mul64x64_128(r22, s22), mul64x64_128(r20 * 2, r21));
    d[2] = add128(mul64x64_128(r21, r21), mul64x64_128(r22 * 2, r20));

    r20 = lo128(d[0]) & 0xfffffffffff;
    c = shr128(d[0], 44);
    d[1] = add128_64(d[1], c);
    r21 = lo128(d[1]) & 0xfffffffffff;
    c = shr128(d[1], 44);
    d[2] = add128_64(d[2], c);
    r22 = lo128(d[2]) & 0x3ffffffffff;
    c = shr128(d[2], 42);
    r20 += c * 5;
    c = (r20 >> 44);
    r20 = r20 & 0xfffffffffff;
    r21 += c;

    p->R20.v = _mm_shuffle_epi32(_mm_cvtsi32_si128((uint32_t)(r20) & 0x3ffffff),
                                 _MM_SHUFFLE(1, 0, 1, 0));
    p->R21.v = _mm_shuffle_epi32(
        _mm_cvtsi32_si128((uint32_t)((r20 >> 26) | (r21 << 18)) & 0x3ffffff),
        _MM_SHUFFLE(1, 0, 1, 0));
    p->R22.v =
        _mm_shuffle_epi32(_mm_cvtsi32_si128((uint32_t)((r21 >> 8)) & 0x3ffffff),
                          _MM_SHUFFLE(1, 0, 1, 0));
    p->R23.v = _mm_shuffle_epi32(
        _mm_cvtsi32_si128((uint32_t)((r21 >> 34) | (r22 << 10)) & 0x3ffffff),
        _MM_SHUFFLE(1, 0, 1, 0));
    p->R24.v = _mm_shuffle_epi32(_mm_cvtsi32_si128((uint32_t)((r22 >> 16))),
                                 _MM_SHUFFLE(1, 0, 1, 0));
    p->S21.v = _mm_mul_epu32(p->R21.v, FIVE);
    p->S22.v = _mm_mul_epu32(p->R22.v, FIVE);
    p->S23.v = _mm_mul_epu32(p->R23.v, FIVE);
    p->S24.v = _mm_mul_epu32(p->R24.v, FIVE);
    p--;
  }

  // put saved info back
  p = &st->P[1];
  p->R20.d[1] = (uint32_t)(r0);
  p->R20.d[3] = (uint32_t)(r0 >> 32);
  p->R21.d[1] = (uint32_t)(r1);
  p->R21.d[3] = (uint32_t)(r1 >> 32);
  p->R22.d[1] = (uint32_t)(r2);
  p->R22.d[3] = (uint32_t)(r2 >> 32);
  p->R23.d[1] = (uint32_t)(pad0);
  p->R23.d[3] = (uint32_t)(pad0 >> 32);
  p->R24.d[1] = (uint32_t)(pad1);
  p->R24.d[3] = (uint32_t)(pad1 >> 32);

  // H = [Mx,My]
  T5 = _mm_unpacklo_epi64(_mm_loadl_epi64((const xmmi *)(m + 0)),
                          _mm_loadl_epi64((const xmmi *)(m + 16)));
  T6 = _mm_unpacklo_epi64(_mm_loadl_epi64((const xmmi *)(m + 8)),
                          _mm_loadl_epi64((const xmmi *)(m + 24)));
  st->H[0] = _mm_and_si128(MMASK, T5);
  st->H[1] = _mm_and_si128(MMASK, _mm_srli_epi64(T5, 26));
  T5 = _mm_or_si128(_mm_srli_epi64(T5, 52), _mm_slli_epi64(T6, 12));
  st->H[2] = _mm_and_si128(MMASK, T5);
  st->H[3] = _mm_and_si128(MMASK, _mm_srli_epi64(T5, 26));
  st->H[4] = _mm_or_si128(_mm_srli_epi64(T6, 40), HIBIT);
}